

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplCyclic.cpp
# Opt level: O2

void __thiscall PimplCyclic::Cyclic::Impl::doSomething(Impl *this)

{
  ostream *poVar1;
  __shared_ptr<PimplCyclic::Cyclic::Impl,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<PimplCyclic::Cyclic::Impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<PimplCyclic::Cyclic::Impl,void>
            (local_20,(__weak_ptr<PimplCyclic::Cyclic::Impl,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::function<void()>::operator=
            ((function<void()> *)&this->_fn,(anon_class_16_1_8991873d *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  poVar1 = std::operator<<((ostream *)&std::cout,"N11PimplCyclic6Cyclic4ImplE");
  poVar1 = std::operator<<(poVar1,"::");
  poVar1 = std::operator<<(poVar1,"doSomething");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void doSomething()
    {
        _fn = [shis = shared_from_this()](){};

        std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
    }